

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

int __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::open
          (Tokenizer<mecab_node_t,_mecab_path_t> *this,char *__file,int __oflag,...)

{
  pointer *pppDVar1;
  char *pcVar2;
  FreeList<mecab_dictionary_info_t> *this_00;
  pointer *pppVar3;
  char cVar4;
  iterator iVar5;
  pointer ppDVar6;
  pointer ppVar7;
  iterator __position;
  uint uVar8;
  uint uVar9;
  Tokenizer<mecab_node_t,_mecab_path_t> *pTVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  Dictionary *pDVar15;
  ostream *poVar16;
  char *pcVar17;
  undefined8 *puVar18;
  size_t sVar19;
  char *pcVar20;
  mecab_dictionary_info_t *pmVar21;
  size_t sVar22;
  unsigned_long uVar23;
  unsigned_long uVar24;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  whatlog *pwVar25;
  char *pcVar26;
  long lVar27;
  long lVar28;
  char *pcVar29;
  undefined8 *puVar30;
  ulong uVar31;
  char *pcVar32;
  ulong uVar33;
  bool bVar34;
  result_type rVar35;
  string tmp;
  Dictionary *sysdic;
  string userdic;
  string prefix;
  undefined1 local_d0 [32];
  Tokenizer<mecab_node_t,_mecab_path_t> *local_b0;
  Param *local_a8;
  Dictionary *local_a0;
  string local_98;
  ostream *local_78;
  vector<MeCab::Dictionary*,std::allocator<MeCab::Dictionary*>> *local_70;
  CharProperty *local_68;
  char *local_60;
  Dictionary *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  close(this,(int)__file);
  local_a8 = (Param *)__file;
  Param::get<std::__cxx11::string>(&local_50,(Param *)__file,"dicdir");
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"unk.dic","");
  create_filename(&local_98,&local_50,(string *)local_d0);
  local_58 = &this->unkdic_;
  iVar12 = Dictionary::open(local_58,local_98._M_dataplus._M_p,0x184d7f);
  iVar13 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
    iVar13 = extraout_EDX_00;
  }
  if ((Dictionary *)local_d0._0_8_ != (Dictionary *)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_);
    iVar13 = extraout_EDX_01;
  }
  if ((char)iVar12 == '\0') {
    pwVar25 = &this->what_;
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pwVar25,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
               ,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar25,"(",1);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)pwVar25,0x67);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,"unkdic_.open(create_filename (prefix, UNK_DIC_FILE).c_str())",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"] ",2);
    pcVar17 = whatlog::str(&(this->unkdic_).what_);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
    }
    else {
      sVar19 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar19);
    }
  }
  else {
    local_68 = &this->property_;
    iVar13 = CharProperty::open(local_68,(char *)local_a8,iVar13);
    if ((char)iVar13 == '\0') {
      pwVar25 = &this->what_;
      std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pwVar25,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                 ,0x6f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar25,"(",1);
      poVar16 = (ostream *)std::ostream::operator<<((ostream *)pwVar25,0x69);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"property_.open(param)",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"] ",2);
      pcVar17 = whatlog::str(&(this->property_).what_);
      if (pcVar17 == (char *)0x0) {
        std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
      }
      else {
        sVar19 = strlen(pcVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar19);
      }
    }
    else {
      pDVar15 = (Dictionary *)operator_new(0x260);
      Dictionary::Dictionary(pDVar15);
      local_d0._0_8_ = local_d0 + 0x10;
      local_a0 = pDVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"sys.dic","");
      create_filename(&local_98,&local_50,(string *)local_d0);
      iVar13 = Dictionary::open(pDVar15,local_98._M_dataplus._M_p,0x184d7f);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((Dictionary *)local_d0._0_8_ != (Dictionary *)(local_d0 + 0x10)) {
        operator_delete((void *)local_d0._0_8_);
      }
      if ((char)iVar13 == '\0') {
        pwVar25 = &this->what_;
        std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pwVar25,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                   ,0x6f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar25,"(",1);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)pwVar25,0x6e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"sysdic->open (create_filename(prefix, SYS_DIC_FILE).c_str())",0x3c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"] ",2);
        pcVar17 = whatlog::str(&local_a0->what_);
        if (pcVar17 == (char *)0x0) {
          std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
        }
        else {
          sVar19 = strlen(pcVar17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar19);
        }
      }
      else {
        if (local_a0->type_ == 0) {
          CharProperty::set_charset(local_68,local_a0->charset_);
          iVar5._M_current =
               (this->dic_).
               super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->dic_).
              super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<MeCab::Dictionary*,std::allocator<MeCab::Dictionary*>>::
            _M_realloc_insert<MeCab::Dictionary*const&>
                      ((vector<MeCab::Dictionary*,std::allocator<MeCab::Dictionary*>> *)&this->dic_,
                       iVar5,&local_a0);
          }
          else {
            *iVar5._M_current = local_a0;
            pppDVar1 = &(this->dic_).
                        super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppDVar1 = *pppDVar1 + 1;
          }
          Param::get<std::__cxx11::string>(&local_98,local_a8,"userdic");
          local_b0 = this;
          if (local_98._M_string_length == 0) {
LAB_0014e7ca:
            this->dictionary_info_ = (DictionaryInfo *)0x0;
            (this->dictionary_info_freelist_).pi_ = 0;
            (this->dictionary_info_freelist_).li_ = 0;
            uVar14 = (int)((ulong)((long)(this->dic_).
                                         super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->dic_).
                                        super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
            if (-1 < (int)uVar14) {
              this_00 = &local_b0->dictionary_info_freelist_;
              lVar27 = (ulong)uVar14 + 1;
              do {
                pmVar21 = FreeList<mecab_dictionary_info_t>::alloc(this_00);
                pmVar21->next = local_b0->dictionary_info_;
                ppDVar6 = (local_b0->dic_).
                          super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pmVar21->filename = (ppDVar6[lVar27 + -1]->filename_)._M_dataplus._M_p;
                pmVar21->charset = ppDVar6[lVar27 + -1]->charset_;
                pDVar15 = ppDVar6[lVar27 + -1];
                uVar14 = pDVar15->type_;
                uVar8 = pDVar15->lsize_;
                uVar9 = pDVar15->rsize_;
                pmVar21->size = pDVar15->lexsize_;
                pmVar21->type = uVar14;
                pmVar21->lsize = uVar8;
                pmVar21->rsize = uVar9;
                pmVar21->version = (unsigned_short)pDVar15->version_;
                local_b0->dictionary_info_ = pmVar21;
                lVar28 = lVar27 + -1;
                bVar34 = 0 < lVar27;
                lVar27 = lVar28;
              } while (lVar28 != 0 && bVar34);
            }
            pTVar10 = local_b0;
            ppVar7 = (local_b0->unk_tokens_).
                     super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((local_b0->unk_tokens_).
                super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != ppVar7) {
              (local_b0->unk_tokens_).
              super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = ppVar7;
            }
            local_70 = (vector<MeCab::Dictionary*,std::allocator<MeCab::Dictionary*>> *)
                       &local_b0->unk_tokens_;
            pwVar25 = &local_b0->what_;
            uVar33 = 0;
            do {
              uVar31 = uVar33;
              sVar22 = CharProperty::size(local_68);
              if (sVar22 <= uVar31) goto LAB_0014ea21;
              pcVar17 = CharProperty::name(local_68,uVar31);
              rVar35 = Dictionary::exactMatchSearch(local_58,pcVar17);
              uVar14 = rVar35.value;
              if (uVar14 == 0xffffffff) {
                std::ios::clear((int)*(undefined8 *)(*(long *)pwVar25 + -0x18) + (int)pwVar25);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pwVar25,
                           "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                           ,0x6f);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar25,"(",1);
                poVar16 = (ostream *)std::ostream::operator<<((ostream *)pwVar25,0x9b);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,") [",3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"n.value != -1",0xd);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"] ",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,"cannot find UNK category: ",0x1a);
                if (pcVar17 == (char *)0x0) {
                  std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
                }
                else {
                  sVar19 = strlen(pcVar17);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar19);
                }
              }
              else {
                local_d0._0_8_ = (pTVar10->unkdic_).token_ + ((int)uVar14 >> 8);
                local_d0._8_8_ = ZEXT48(uVar14 & 0xff);
                __position._M_current =
                     (pTVar10->unk_tokens_).
                     super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (pTVar10->unk_tokens_).
                    super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<std::pair<MeCab::Token_const*,unsigned_long>,std::allocator<std::pair<MeCab::Token_const*,unsigned_long>>>
                  ::_M_realloc_insert<std::pair<MeCab::Token_const*,unsigned_long>>
                            ((vector<std::pair<MeCab::Token_const*,unsigned_long>,std::allocator<std::pair<MeCab::Token_const*,unsigned_long>>>
                              *)local_70,__position,
                             (pair<const_MeCab::Token_*,_unsigned_long> *)local_d0);
                }
                else {
                  (__position._M_current)->first = (Token *)local_d0._0_8_;
                  (__position._M_current)->second = local_d0._8_8_;
                  pppVar3 = &(pTVar10->unk_tokens_).
                             super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *pppVar3 = *pppVar3 + 1;
                }
              }
              uVar33 = uVar31 + 1;
            } while (uVar14 != 0xffffffff);
            if (uVar31 < sVar22) goto LAB_0014ea1a;
LAB_0014ea21:
            pTVar10->space_ = (pTVar10->property_).map_[0x20];
            Param::get<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                       ,local_a8,"bos-feature");
            scoped_string::reset_string(&pTVar10->bos_feature_,(string *)local_d0);
            if ((Dictionary *)local_d0._0_8_ != (Dictionary *)(local_d0 + 0x10)) {
              operator_delete((void *)local_d0._0_8_);
            }
            Param::get<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                       ,local_a8,"unk-feature");
            pcVar17 = (pTVar10->unk_feature_).super_scoped_array<char>.ptr_;
            if (pcVar17 != (char *)0x0) {
              operator_delete__(pcVar17);
            }
            (pTVar10->unk_feature_).super_scoped_array<char>.ptr_ = (char *)0x0;
            if (local_d0._8_8_ != 0) {
              scoped_string::reset_string(&pTVar10->unk_feature_,(string *)local_d0);
            }
            bVar34 = *(pTVar10->bos_feature_).super_scoped_array<char>.ptr_ == '\0';
            iVar13 = (int)CONCAT71((int7)(uVar31 >> 8),!bVar34);
            if (bVar34) {
              std::ios::clear((int)*(undefined8 *)(*(long *)&pTVar10->what_ + -0x18) + (int)pwVar25)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pwVar25,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                         ,0x6f);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar25,"(",1);
              poVar16 = (ostream *)std::ostream::operator<<((ostream *)pwVar25,0xab);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,"*bos_feature_ != \'\\0\'",0x15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"] ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,"bos-feature is undefined in dicrc",0x21);
            }
            else {
              uVar23 = Param::get<unsigned_long>(local_a8,"max-grouping-size");
              uVar24 = 0x18;
              if (uVar23 != 0) {
                uVar24 = uVar23;
              }
              pTVar10->max_grouping_size_ = uVar24;
            }
            if ((Dictionary *)local_d0._0_8_ != (Dictionary *)(local_d0 + 0x10)) {
              operator_delete((void *)local_d0._0_8_);
            }
          }
          else {
            pcVar17 = (char *)operator_new__(0x2000);
            local_60 = pcVar17;
            puVar18 = (undefined8 *)operator_new__(0x10000);
            uVar33 = 0x2000;
            local_70 = (vector<MeCab::Dictionary*,std::allocator<MeCab::Dictionary*>> *)&this->dic_;
            strncpy(pcVar17,local_98._M_dataplus._M_p,0x2000);
            sVar19 = strlen(pcVar17);
            if ((long)sVar19 < 1) {
              uVar31 = 0;
            }
            else {
              pcVar32 = pcVar17 + sVar19;
              uVar31 = 0;
              puVar30 = puVar18;
              do {
                for (; (cVar4 = *pcVar17, cVar4 == '\t' || (cVar4 == ' ')); pcVar17 = pcVar17 + 1) {
                }
                if (cVar4 == '\"') {
                  pcVar17 = pcVar17 + 1;
                  pcVar26 = pcVar17;
                  for (pcVar20 = pcVar17;
                      (pcVar29 = pcVar20, pcVar20 < pcVar32 &&
                      ((*pcVar20 != '\"' ||
                       (pcVar29 = pcVar20 + 1, pcVar2 = pcVar20 + 1, pcVar20 = pcVar29,
                       *pcVar2 == '\"')))); pcVar20 = pcVar20 + 1) {
                    *pcVar26 = *pcVar20;
                    pcVar26 = pcVar26 + 1;
                  }
                  local_d0[0] = 0x2c;
                  pcVar20 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                      (pcVar29,pcVar32,local_d0);
                }
                else {
                  local_d0[0] = 0x2c;
                  pcVar20 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                      (pcVar17,pcVar32,local_d0);
                  pcVar26 = pcVar20;
                }
                if (1 < uVar33) {
                  *pcVar26 = '\0';
                }
                uVar33 = uVar33 - 1;
                *puVar30 = pcVar17;
                uVar31 = uVar31 + 1;
                this = local_b0;
                if (uVar33 == 0) break;
                puVar30 = puVar30 + 1;
                pcVar17 = pcVar20 + 1;
              } while (pcVar17 < pcVar32);
            }
            bVar34 = uVar31 != 0;
            if (bVar34) {
              local_78 = (ostream *)&this->what_;
              uVar33 = 1;
              while( true ) {
                pDVar15 = (Dictionary *)operator_new(0x260);
                Dictionary::Dictionary(pDVar15);
                local_d0._0_8_ = pDVar15;
                iVar13 = Dictionary::open(pDVar15,(char *)puVar18[uVar33 - 1],0x184d7f);
                poVar16 = local_78;
                if ((char)iVar13 == '\0') {
                  std::ios::clear((int)*(undefined8 *)(*(long *)local_78 + -0x18) + (int)local_78);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                             ,0x6f);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"(",1);
                  poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,0x7f);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,") [",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,"d->open(dicfile[i])",0x13);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"] ",2);
                  pcVar17 = whatlog::str((whatlog *)(local_d0._0_8_ + 0x68));
                  if (pcVar17 == (char *)0x0) {
                    std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
                  }
                  else {
                    sVar19 = strlen(pcVar17);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar19);
                  }
                  goto LAB_0014e7ad;
                }
                if (*(uint *)(local_d0._0_8_ + 0x34) != 1) break;
                bVar11 = Dictionary::isCompatible(local_a0,(Dictionary *)local_d0._0_8_);
                poVar16 = local_78;
                if (!bVar11) {
                  std::ios::clear((int)*(undefined8 *)(*(long *)local_78 + -0x18) + (int)local_78);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                             ,0x6f);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"(",1);
                  poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,0x82);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,") [",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,"sysdic->isCompatible(*d)",0x18);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"] ",2);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,"incompatible dictionary: ",0x19);
                  pcVar17 = (char *)puVar18[uVar33 - 1];
                  if (pcVar17 == (char *)0x0) {
                    std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
                  }
                  else {
                    sVar19 = strlen(pcVar17);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar19);
                  }
                  goto LAB_0014e7ad;
                }
                iVar5._M_current =
                     (this->dic_).
                     super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (this->dic_).
                    super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<MeCab::Dictionary*,std::allocator<MeCab::Dictionary*>>::
                  _M_realloc_insert<MeCab::Dictionary*const&>
                            (local_70,iVar5,(Dictionary **)local_d0);
                }
                else {
                  *iVar5._M_current = (Dictionary *)local_d0._0_8_;
                  pppDVar1 = &(this->dic_).
                              super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  *pppDVar1 = *pppDVar1 + 1;
                }
                bVar34 = uVar33 < uVar31;
                bVar11 = uVar33 == uVar31;
                uVar33 = uVar33 + 1;
                if (bVar11) goto LAB_0014e7ad;
              }
              std::ios::clear((int)*(undefined8 *)(*(long *)local_78 + -0x18) + (int)local_78);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                         ,0x6f);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"(",1);
              poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,0x80);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"d->type() == 1",0xe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"] ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,"not a user dictionary: ",0x17);
              pcVar17 = (char *)puVar18[uVar33 - 1];
              if (pcVar17 == (char *)0x0) {
                std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
              }
              else {
                sVar19 = strlen(pcVar17);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar19);
              }
            }
LAB_0014e7ad:
            operator_delete__(puVar18);
            operator_delete__(local_60);
            if (!bVar34) goto LAB_0014e7ca;
LAB_0014ea1a:
            iVar13 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          goto LAB_0014e2d6;
        }
        pwVar25 = &this->what_;
        std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pwVar25,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                   ,0x6f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar25,"(",1);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)pwVar25,0x71);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"sysdic->type() == 0",0x13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"not a system dictionary: ",0x19)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,local_50._M_dataplus._M_p,local_50._M_string_length);
      }
    }
  }
  iVar13 = 0;
LAB_0014e2d6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return iVar13;
}

Assistant:

bool Tokenizer<N, P>::open(const Param &param) {
  close();

  const std::string prefix = param.template get<std::string>("dicdir");

  CHECK_FALSE(unkdic_.open(create_filename
                                 (prefix, UNK_DIC_FILE).c_str()))
      << unkdic_.what();
  CHECK_FALSE(property_.open(param)) << property_.what();

  Dictionary *sysdic = new Dictionary;

  CHECK_FALSE(sysdic->open
                    (create_filename(prefix, SYS_DIC_FILE).c_str()))
      << sysdic->what();

  CHECK_FALSE(sysdic->type() == 0)
      << "not a system dictionary: " << prefix;

  property_.set_charset(sysdic->charset());
  dic_.push_back(sysdic);

  const std::string userdic = param.template get<std::string>("userdic");
  if (!userdic.empty()) {
    scoped_fixed_array<char, BUF_SIZE> buf;
    scoped_fixed_array<char *, BUF_SIZE> dicfile;
    std::strncpy(buf.get(), userdic.c_str(), buf.size());
    const size_t n = tokenizeCSV(buf.get(), dicfile.get(), dicfile.size());
    for (size_t i = 0; i < n; ++i) {
      Dictionary *d = new Dictionary;
      CHECK_FALSE(d->open(dicfile[i])) << d->what();
      CHECK_FALSE(d->type() == 1)
          << "not a user dictionary: " << dicfile[i];
      CHECK_FALSE(sysdic->isCompatible(*d))
          << "incompatible dictionary: " << dicfile[i];
      dic_.push_back(d);
    }
  }

  dictionary_info_ = 0;
  dictionary_info_freelist_.free();
  for (int i = static_cast<int>(dic_.size() - 1); i >= 0; --i) {
    DictionaryInfo *d = dictionary_info_freelist_.alloc();
    d->next          = dictionary_info_;
    d->filename      = dic_[i]->filename();
    d->charset       = dic_[i]->charset();
    d->size          = dic_[i]->size();
    d->lsize         = dic_[i]->lsize();
    d->rsize         = dic_[i]->rsize();
    d->type          = dic_[i]->type();
    d->version       = dic_[i]->version();
    dictionary_info_ = d;
  }

  unk_tokens_.clear();
  for (size_t i = 0; i < property_.size(); ++i) {
    const char *key = property_.name(i);
    const Dictionary::result_type n = unkdic_.exactMatchSearch(key);
    CHECK_FALSE(n.value != -1) << "cannot find UNK category: " << key;
    const Token *token = unkdic_.token(n);
    size_t size = unkdic_.token_size(n);
    unk_tokens_.push_back(std::make_pair(token, size));
  }

  space_ = property_.getCharInfo(0x20);  // ad-hoc

  bos_feature_.reset_string(param.template get<std::string>("bos-feature"));

  const std::string tmp = param.template get<std::string>("unk-feature");
  unk_feature_.reset(0);
  if (!tmp.empty()) {
    unk_feature_.reset_string(tmp);
  }

  CHECK_FALSE(*bos_feature_ != '\0')
      << "bos-feature is undefined in dicrc";

  max_grouping_size_ = param.template get<size_t>("max-grouping-size");
  if (max_grouping_size_ == 0) {
    max_grouping_size_ = DEFAULT_MAX_GROUPING_SIZE;
  }

  return true;
}